

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O3

void rw::writeBMP(Image *image,char *filename)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  byte bVar4;
  void *__buf;
  undefined4 *data;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  BMPheader bmp;
  StreamFile local_88;
  BMPheader local_78;
  undefined4 local_68;
  undefined8 local_64;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  
  local_88.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00148c40;
  local_88.file = (FILE *)0x0;
  iVar1 = StreamFile::open(&local_88,filename,0x134ffd);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    writeBMP((rw *)filename);
  }
  else {
    iVar1 = image->depth;
    uVar6 = 0x100;
    if (iVar1 == 4) {
      uVar6 = 0x10;
    }
    iVar2 = image->width * iVar1;
    iVar3 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    local_78.magic = 0x4d42;
    __buf = (void *)0x36;
    if (iVar1 < 9) {
      __buf = (void *)(ulong)(uVar6 * 4 + 0x36);
    }
    local_78.offset = (uint32)__buf;
    local_78.size = ((iVar3 >> 3) + 3U & 0xfffffffc) * image->height + local_78.offset;
    local_78.reserved[0] = 0;
    local_78.reserved[1] = 0;
    BMPheader::write(&local_78,(int)&local_88,__buf,(ulong)local_78.size);
    iVar3 = 0x18;
    if (iVar1 != 0x20) {
      iVar3 = iVar1;
    }
    data = &local_68;
    local_68 = 0x28;
    local_64._0_4_ = image->width;
    local_64._4_4_ = image->height;
    local_5c = 1;
    local_5a = (undefined2)iVar3;
    local_58 = 0;
    uStack_50 = 0xb1300000b13;
    local_48 = 0;
    StreamFile::write8(&local_88,data,0x28);
    if (iVar1 < 9) {
      uVar5 = 0;
      do {
        Stream::writeU8(&local_88.super_Stream,image->palette[uVar5 * 4 + 2]);
        Stream::writeU8(&local_88.super_Stream,image->palette[uVar5 * 4 + 1]);
        Stream::writeU8(&local_88.super_Stream,image->palette[uVar5 * 4]);
        data = (undefined4 *)0xff;
        Stream::writeU8(&local_88.super_Stream,0xff);
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
    iVar1 = (int)data;
    if (0 < (long)image->height) {
      pbVar8 = image->pixels + (long)image->stride * ((long)image->height + -1);
      iVar3 = 0;
      do {
        pbVar7 = pbVar8;
        if (0 < image->width) {
          iVar1 = 0;
          do {
            switch(image->depth << 0x1e | image->depth - 4U >> 2) {
            case 0:
              bVar4 = pbVar7[1] & 0xf | *pbVar7 << 4;
              data = (undefined4 *)(ulong)bVar4;
              Stream::writeU8(&local_88.super_Stream,bVar4);
              pbVar7 = pbVar7 + 2;
              iVar1 = iVar1 + 1;
              break;
            case 1:
              bVar4 = *pbVar7;
              data = (undefined4 *)(ulong)bVar4;
              pbVar7 = pbVar7 + 1;
              Stream::writeU8(&local_88.super_Stream,bVar4);
              break;
            case 3:
              Stream::writeU8(&local_88.super_Stream,*pbVar7);
              data = (undefined4 *)(ulong)pbVar7[1];
              Stream::writeU8(&local_88.super_Stream,pbVar7[1]);
              pbVar7 = pbVar7 + 2;
              break;
            case 5:
              Stream::writeU8(&local_88.super_Stream,pbVar7[2]);
              Stream::writeU8(&local_88.super_Stream,pbVar7[1]);
              data = (undefined4 *)(ulong)*pbVar7;
              Stream::writeU8(&local_88.super_Stream,*pbVar7);
              pbVar7 = pbVar7 + 3;
              break;
            case 7:
              Stream::writeU8(&local_88.super_Stream,pbVar7[2]);
              Stream::writeU8(&local_88.super_Stream,pbVar7[1]);
              data = (undefined4 *)(ulong)*pbVar7;
              Stream::writeU8(&local_88.super_Stream,*pbVar7);
              pbVar7 = pbVar7 + 4;
            }
            iVar1 = iVar1 + 1;
          } while (iVar1 < image->width);
        }
        uVar5 = ((long)pbVar7 - (long)pbVar8) % 4;
        if (uVar5 != 0) {
          do {
            data = (undefined4 *)0x0;
            Stream::writeU8(&local_88.super_Stream,'\0');
            uVar6 = (int)uVar5 - 1;
            uVar5 = (ulong)uVar6;
          } while (uVar6 != 0);
        }
        iVar1 = (int)data;
        pbVar8 = pbVar8 + -(long)image->stride;
        iVar3 = iVar3 + 1;
      } while (iVar3 < image->height);
    }
    StreamFile::close(&local_88,iVar1);
  }
  return;
}

Assistant:

void
writeBMP(Image *image, const char *filename)
{
	ASSERTLITTLE;
	uint8 *p;
	StreamFile file;
	if(!file.open(filename, "wb")){
		RWERROR((ERR_FILE, filename));
		return;
	}

	int32 pallen = image->depth > 8  ? 0 :
	               image->depth == 4 ? 16 : 256;
	int32 stride = image->width*image->depth/8;
	int32 depth = image->depth == 32 ? 24 : image->depth;
	stride = stride+3 & ~3;

	// File headers
	BMPheader bmp;
	bmp.magic = 0x4D42;	// BM
	bmp.size = 0x36 + 4*pallen + image->height*stride;
	bmp.reserved[0] = 0;
	bmp.reserved[1] = 0;
	bmp.offset = 0x36 + 4*pallen;
	bmp.write(&file);

	DIBheader dib;
	dib.headerSize = 0x28;
	dib.width = image->width;
	dib.height = image->height;
	dib.numPlanes = 1;
	dib.depth = depth;
	dib.compression = 0;
	dib.imgSize = 0;
	dib.hres = 2835;	// 72dpi
	dib.vres = 2835;	// 72dpi
	dib.paletteLen = 0;
	dib.numImportant = 0;
	file.write8(&dib, dib.headerSize);

	for(int i = 0; i < pallen; i++){
		file.writeU8(image->palette[i*4+2]);
		file.writeU8(image->palette[i*4+1]);
		file.writeU8(image->palette[i*4+0]);
		file.writeU8(0xFF);
	}

	uint8 *line = image->pixels + (image->height-1)*image->stride;
	int32 n;
	for(int y = 0; y < image->height; y++){
		p = line;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
				file.writeU8((p[0]&0xF)<<4 | (p[1]&0xF));
				p += 2;
				x++;
				break;
			case 8:
				file.writeU8(*p++);
				break;
			case 16:
				file.writeU8(p[0]);
				file.writeU8(p[1]);
				p += 2;
				break;
			case 24:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				p += 3;
				break;
			case 32:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				p += 4;
			}
		}
		n = (p-line) % 4;
		while(n--)
			file.writeU8(0);
		line -= image->stride;
	}

	file.close();
}